

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Net::register_custom_layer(Net *this,int index,layer_creator_func creator)

{
  vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_> *this_00;
  int iVar1;
  uint uVar2;
  layer_registry_entry dummy;
  value_type local_38;
  
  uVar2 = index & 0xfffffeff;
  if (uVar2 == index) {
    register_custom_layer((Net *)(ulong)uVar2);
    iVar1 = -1;
  }
  else {
    this_00 = &this->custom_layer_registry;
    if ((int)((ulong)((long)(this->custom_layer_registry).
                            super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->custom_layer_registry).
                           super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) <= (int)uVar2) {
      local_38.name = "";
      local_38.creator = (layer_creator_func)0x0;
      std::vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>::resize
                (this_00,(long)(int)(uVar2 + 1),&local_38);
    }
    if ((this_00->
        super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>)
        ._M_impl.super__Vector_impl_data._M_start[(int)uVar2].creator != (layer_creator_func)0x0) {
      register_custom_layer((Net *)(ulong)uVar2);
    }
    (this_00->
    super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>).
    _M_impl.super__Vector_impl_data._M_start[(int)uVar2].creator = creator;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Net::register_custom_layer(int index, layer_creator_func creator)
{
    int custom_index = index & ~LayerType::CustomBit;
    if (index == custom_index)
    {
        NCNN_LOGE("can not register build-in layer index %d", custom_index);
        return -1;
    }

    if ((int)custom_layer_registry.size() <= custom_index)
    {
#if NCNN_STRING
        struct layer_registry_entry dummy = { "", 0 };
#else
        struct layer_registry_entry dummy = { 0 };
#endif // NCNN_STRING
        custom_layer_registry.resize(custom_index + 1, dummy);
    }

    if (custom_layer_registry[custom_index].creator)
    {
        NCNN_LOGE("overwrite existing custom layer index %d", custom_index);
    }

    custom_layer_registry[custom_index].creator = creator;
    return 0;
}